

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCMakePresetsGraphReadJSONConfigurePresets.cxx
# Opt level: O1

bool anon_unknown.dwarf_82cecd::TraceEnableModeHelper
               (optional<cmCMakePresetsGraph::TraceEnableMode> *out,Value *value,cmJSONState *state)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  bool bVar2;
  int iVar3;
  _Optional_payload_base<cmCMakePresetsGraph::TraceEnableMode> _Var4;
  String local_50;
  
  if (value == (Value *)0x0) {
    if ((out->super__Optional_base<cmCMakePresetsGraph::TraceEnableMode,_true,_true>)._M_payload.
        super__Optional_payload_base<cmCMakePresetsGraph::TraceEnableMode>._M_engaged != true) {
      return true;
    }
    (out->super__Optional_base<cmCMakePresetsGraph::TraceEnableMode,_true,_true>)._M_payload.
    super__Optional_payload_base<cmCMakePresetsGraph::TraceEnableMode>._M_engaged = false;
    return true;
  }
  bVar2 = Json::Value::isString(value);
  if (bVar2) {
    Json::Value::asString_abi_cxx11_(&local_50,value);
    iVar3 = std::__cxx11::string::compare((char *)&local_50);
    paVar1 = &local_50.field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != paVar1) {
      operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
    }
    if (iVar3 == 0) {
      _Var4._M_payload = (_Storage<cmCMakePresetsGraph::TraceEnableMode,_true>)0x1;
      _Var4._M_engaged = true;
      _Var4._5_3_ = 0;
    }
    else {
      Json::Value::asString_abi_cxx11_(&local_50,value);
      iVar3 = std::__cxx11::string::compare((char *)&local_50);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_50._M_dataplus._M_p != paVar1) {
        operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
      }
      if (iVar3 == 0) {
        _Var4._M_payload = (_Storage<cmCMakePresetsGraph::TraceEnableMode,_true>)0x0;
        _Var4._M_engaged = true;
        _Var4._5_3_ = 0;
      }
      else {
        Json::Value::asString_abi_cxx11_(&local_50,value);
        iVar3 = std::__cxx11::string::compare((char *)&local_50);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_50._M_dataplus._M_p != paVar1) {
          operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
        }
        if (iVar3 != 0) goto LAB_00283ca3;
        _Var4._M_payload = (_Storage<cmCMakePresetsGraph::TraceEnableMode,_true>)0x2;
        _Var4._M_engaged = true;
        _Var4._5_3_ = 0;
      }
    }
    (out->super__Optional_base<cmCMakePresetsGraph::TraceEnableMode,_true,_true>)._M_payload.
    super__Optional_payload_base<cmCMakePresetsGraph::TraceEnableMode> = _Var4;
    bVar2 = true;
  }
  else {
LAB_00283ca3:
    cmCMakePresetsErrors::INVALID_PRESET(value,state);
    bVar2 = false;
  }
  return bVar2;
}

Assistant:

bool TraceEnableModeHelper(cm::optional<TraceEnableMode>& out,
                           const Json::Value* value, cmJSONState* state)
{
  if (!value) {
    out = cm::nullopt;
    return true;
  }

  if (!value->isString()) {
    cmCMakePresetsErrors::INVALID_PRESET(value, state);
    return false;
  }

  if (value->asString() == "on") {
    out = TraceEnableMode::Default;
  } else if (value->asString() == "off") {
    out = TraceEnableMode::Disable;
  } else if (value->asString() == "expand") {
    out = TraceEnableMode::Expand;
  } else {
    cmCMakePresetsErrors::INVALID_PRESET(value, state);
    return false;
  }

  return true;
}